

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

uint __thiscall ExpressionContext::GetTypeIndex(ExpressionContext *this,TypeBase *type)

{
  uint local_20;
  uint e;
  uint i;
  uint index;
  TypeBase *type_local;
  ExpressionContext *this_local;
  
  e = 0xffffffff;
  local_20 = 0;
  do {
    if ((this->types).count <= local_20) {
LAB_002281f4:
      if (e != 0xffffffff) {
        return e;
      }
      __assert_fail("index != ~0u",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x612,"unsigned int ExpressionContext::GetTypeIndex(TypeBase *)");
    }
    if ((this->types).data[local_20] == type) {
      e = local_20;
      goto LAB_002281f4;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

unsigned ExpressionContext::GetTypeIndex(TypeBase *type)
{
	unsigned index = ~0u;

	for(unsigned i = 0, e = types.count; i < e; i++)
	{
		if(types.data[i] == type)
		{
			index = i;
			break;
		}
	}

	assert(index != ~0u);

	return index;
}